

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *value;
  xmlRelaxNGDefinePtr_conflict payload;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlNodePtr pxVar4;
  xmlHashTablePtr hash;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  char *pcVar8;
  xmlNs *pxVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  if (nodes == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x40d,"grammar has no children\n",(xmlChar *)0x0,(xmlChar *)0x0)
    ;
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0;
    for (; nodes != (xmlNode *)0x0; nodes = nodes->next) {
      uVar10 = 0xffffffff;
      uVar7 = uVar10;
      if ((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) {
LAB_0017d0a5:
        value = nodes->name;
        iVar2 = 0x40c;
        pcVar8 = "grammar has unexpected child %s\n";
LAB_0017d0b7:
        xmlRngPErr(ctxt,nodes,iVar2,pcVar8,value,(xmlChar *)0x0);
        uVar7 = uVar10;
      }
      else {
        iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"start");
        pxVar9 = nodes->ns;
        if (iVar2 != 0) {
          iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar2 == 0) {
            pxVar9 = nodes->ns;
            goto LAB_0017cef1;
          }
          if (nodes->children == (xmlNodePtr)0x0) {
            iVar2 = 0x452;
            pcVar8 = "start has no children\n";
LAB_0017cff4:
            xmlRngPErr(ctxt,nodes,iVar2,pcVar8,(xmlChar *)0x0,(xmlChar *)0x0);
            uVar7 = uVar11;
          }
          else {
            iVar2 = xmlRelaxNGParseStart(ctxt,nodes->children);
            uVar7 = -(uint)(iVar2 != 0) | uVar11;
          }
          goto LAB_0017d0c2;
        }
LAB_0017cef1:
        if ((pxVar9 == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) goto LAB_0017d0a5;
        iVar2 = xmlStrEqual(nodes->name,"define");
        pxVar9 = nodes->ns;
        if (iVar2 != 0) {
          iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar2 == 0) {
            pxVar9 = nodes->ns;
            goto LAB_0017d00b;
          }
          value = xmlGetProp(nodes,"name");
          if (value == (xmlChar *)0x0) {
            iVar2 = 0x3f6;
            pcVar8 = "define has no name\n";
            goto LAB_0017cff4;
          }
          xmlRelaxNGNormExtSpace(value);
          iVar2 = xmlValidateNCName(value,0);
          if (iVar2 != 0) {
            xmlRngPErr(ctxt,nodes,0x419,"define name \'%s\' is not an NCName\n",value,(xmlChar *)0x0
                      );
          }
          payload = xmlRelaxNGNewDefine(ctxt,nodes);
          if (payload == (xmlRelaxNGDefinePtr_conflict)0x0) {
            (*xmlFree)(value);
            goto LAB_0017d0c2;
          }
          payload->type = XML_RELAXNG_DEF;
          payload->name = value;
          pxVar4 = nodes->children;
          if (pxVar4 == (xmlNodePtr)0x0) {
            xmlRngPErr(ctxt,nodes,0x3f4,"define has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            pxVar1 = ctxt->define;
            ctxt->define = value;
            pxVar3 = xmlRelaxNGParsePatterns(ctxt,pxVar4,0);
            payload->content = pxVar3;
            ctxt->define = pxVar1;
          }
          hash = ctxt->grammar->defs;
          if (hash == (xmlHashTablePtr)0x0) {
            hash = xmlHashCreate(10);
            ctxt->grammar->defs = hash;
            if (hash != (xmlHashTablePtr)0x0) goto LAB_0017d13f;
            iVar2 = 0x3f3;
            pcVar8 = "Could not create definition hash\n";
            goto LAB_0017d1e9;
          }
LAB_0017d13f:
          iVar2 = xmlHashAddEntry(hash,value,payload);
          uVar7 = uVar11;
          if (-1 < iVar2) goto LAB_0017d0c2;
          pvVar5 = xmlHashLookup(ctxt->grammar->defs,value);
          if (pvVar5 != (void *)0x0) {
            do {
              pvVar6 = pvVar5;
              pvVar5 = *(void **)((long)pvVar6 + 0x58);
            } while (pvVar5 != (void *)0x0);
            *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar6 + 0x58) = payload;
            goto LAB_0017d0c2;
          }
          iVar2 = 0x3f3;
          pcVar8 = "Internal error on define aggregation of %s\n";
          goto LAB_0017d0b7;
        }
LAB_0017d00b:
        if ((((pxVar9 == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
            (iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"include"), iVar2 == 0)) ||
           (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
           iVar2 == 0)) goto LAB_0017d0a5;
        if (nodes->psvi == (void *)0x0) {
          iVar2 = 0x412;
          pcVar8 = "Include node has no data\n";
LAB_0017d1e9:
          value = (xmlChar *)0x0;
          goto LAB_0017d0b7;
        }
        pxVar4 = xmlDocGetRootElement(*(xmlDoc **)((long)nodes->psvi + 0x10));
        if (pxVar4 == (xmlNodePtr)0x0) {
          iVar2 = 0x3fe;
          pcVar8 = "Include document is empty\n";
          goto LAB_0017d1e9;
        }
        iVar2 = xmlStrEqual(pxVar4->name,"grammar");
        if (iVar2 == 0) {
          iVar2 = 0x40e;
          pcVar8 = "Include document root is not a grammar\n";
          goto LAB_0017d1e9;
        }
        if (pxVar4->children == (xmlNodePtr)0x0) {
          bVar12 = true;
        }
        else {
          iVar2 = xmlRelaxNGParseGrammarContent(ctxt,pxVar4->children);
          bVar12 = iVar2 == 0;
        }
        if (((nodes->children == (xmlNodePtr)0x0) ||
            (iVar2 = xmlRelaxNGParseGrammarContent(ctxt,nodes->children), iVar2 == 0)) &&
           (uVar7 = uVar11, !bVar12)) {
          uVar7 = uVar10;
        }
      }
LAB_0017d0c2:
      uVar11 = uVar7;
    }
  }
  return uVar11;
}

Assistant:

static int
xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,
                              xmlNodePtr nodes)
{
    int ret = 0, tmp;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_EMPTY,
                   "grammar has no children\n", NULL, NULL);
        return (-1);
    }
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "start")) {
            if (nodes->children == NULL) {
                xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY,
                           "start has no children\n", NULL, NULL);
            } else {
                tmp = xmlRelaxNGParseStart(ctxt, nodes->children);
                if (tmp != 0)
                    ret = -1;
            }
        } else if (IS_RELAXNG(nodes, "define")) {
            tmp = xmlRelaxNGParseDefine(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else if (IS_RELAXNG(nodes, "include")) {
            tmp = xmlRelaxNGParseInclude(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else {
            xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                       "grammar has unexpected child %s\n", nodes->name,
                       NULL);
            ret = -1;
        }
        nodes = nodes->next;
    }
    return (ret);
}